

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapedLatticePentRod.cpp
# Opt level: O2

bool __thiscall OpenMD::shapedLatticePentRod::isInterior(shapedLatticePentRod *this,Vector3d *point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = (point->super_Vector<double,_3U>).data_[2];
  if ((dVar1 < 0.0) && (this->rodRadius_ * -0.816496581 + -1.44 <= dVar1)) {
    dVar2 = (point->super_Vector<double,_3U>).data_[0];
    dVar3 = (point->super_Vector<double,_3U>).data_[1];
    dVar4 = (dVar2 - dVar3) * 0.7071067811865476;
    return (bool)(-(dVar4 <= (dVar1 + 1.44) * -0.7071067808917132) &
                  -(ABS((dVar2 + dVar3) * 0.7071067811865476) <=
                   this->rodRadius_ * 0.5773502692 + (dVar1 / 2.04) * 1.44 + this->rodLength_ * 0.5)
                 & (dVar1 + -1.44) * 0.7071067808917132 <= dVar4);
  }
  return false;
}

Assistant:

bool shapedLatticePentRod::isInterior(Vector3d point) {
    RealType x, y, z, new_x, new_y, left_newx, right_newx;
    // int z_int;

    bool isIT = false;

    x = point[0];
    y = point[1];
    z = point[2];

    // z_int = int(z/2.04);

    // Rotate by 45 degrees around z-axis so length of rod lies along y axis
    new_x = (sqrt(2.0) / 2) * (x - y);
    new_y = (sqrt(2.0) / 2) * (x + y);

    left_newx  = (z - 1.44) * (0.577350269 / 0.816496581);
    right_newx = (z + 1.44) * (-0.577350269 / 0.816496581);

    // Make center spine of nanorod down new_y axis
    // This is now done directly in nanorod_pentBuilder.cpp
    /*if ( (new_x == 0) && (z == 0) ) {

    if ( abs(new_y) <= 0.5*rodLength_ + 0.5773502692*rodRadius_ ) {

      isIT = true;

    }
    }*/

    // Make one wedge
    if ((z < 0) && (z >= -0.816496581 * rodRadius_ - 1.44)) {
      if (abs(new_y) <=
          1.44 * (z / 2.04) + 0.5 * rodLength_ + 0.5773502692 * rodRadius_) {
        if ((new_x >= left_newx) && (new_x <= right_newx)) { isIT = true; }
      }
    }
    return isIT;
  }